

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool picojson::
     _parse_object<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
               (default_parse_context *ctx,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  bool bVar1;
  undefined1 local_40 [8];
  string key;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in_local;
  default_parse_context *ctx_local;
  
  key.field_2._8_8_ = in;
  bVar1 = default_parse_context::parse_object_start(ctx);
  if (bVar1) {
    bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect
                      ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                       key.field_2._8_8_,0x7d);
    if (bVar1) {
      ctx_local._7_1_ = 1;
    }
    else {
      do {
        std::__cxx11::string::string((string *)local_40);
        bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect
                          ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                           key.field_2._8_8_,0x22);
        if (((bVar1) &&
            (bVar1 = _parse_string<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,
                                (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                                key.field_2._8_8_), bVar1)) &&
           (bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect
                              ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                               key.field_2._8_8_,0x3a), bVar1)) {
          bVar1 = default_parse_context::
                  parse_object_item<std::istreambuf_iterator<char,std::char_traits<char>>>
                            (ctx,(input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                                 key.field_2._8_8_,(string *)local_40);
          if (bVar1) {
            bVar1 = false;
          }
          else {
            ctx_local._7_1_ = 0;
            bVar1 = true;
          }
        }
        else {
          ctx_local._7_1_ = 0;
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)local_40);
        if (bVar1) goto LAB_0013e477;
        bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect
                          ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                           key.field_2._8_8_,0x2c);
      } while (bVar1);
      ctx_local._7_1_ =
           input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect
                     ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                      key.field_2._8_8_,0x7d);
    }
  }
  else {
    ctx_local._7_1_ = 0;
  }
LAB_0013e477:
  return (bool)(ctx_local._7_1_ & 1);
}

Assistant:

inline bool _parse_object(Context& ctx, input<Iter>& in) {
    if (! ctx.parse_object_start()) {
      return false;
    }
    if (in.expect('}')) {
      return true;
    }
    do {
      std::string key;
      if (! in.expect('"')
      || ! _parse_string(key, in)
      || ! in.expect(':')) {
    return false;
      }
      if (! ctx.parse_object_item(in, key)) {
    return false;
      }
    } while (in.expect(','));
    return in.expect('}');
  }